

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cpp
# Opt level: O0

void __thiscall
ComplexityVectorCoverageComplexityProperty::~ComplexityVectorCoverageComplexityProperty
          (ComplexityVectorCoverageComplexityProperty *this)

{
  ComplexityVectorCoverageComplexityProperty *this_local;
  
  ~ComplexityVectorCoverageComplexityProperty(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

DEF_COMPLEXITY_PROPERTY(VectorCoverage, Complexity, ORDER_N2, const vector<int>&)
{
}